

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

bool __thiscall
args::ArgumentParser::
ParseShort<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              end)

{
  int iVar1;
  undefined4 extraout_var;
  ParseError *pPVar2;
  char cVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string local_98;
  string errorMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argchunk;
  FlagBase *flag;
  
  std::__cxx11::string::substr((ulong)&argchunk,(ulong)it->_M_current);
  _Var4 = argchunk._M_dataplus;
  do {
    if (_Var4._M_p == argchunk._M_dataplus._M_p + argchunk._M_string_length) {
      cVar3 = '\x02';
      break;
    }
    value._M_dataplus._M_p._1_1_ = *_Var4._M_p;
    value._M_dataplus._M_p._0_1_ = 1;
    value._M_string_length = (long)&value.field_2 + 8;
    value.field_2._M_allocated_capacity = 0;
    value.field_2._M_local_buf[8] = '\0';
    iVar1 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,&value);
    flag = (FlagBase *)CONCAT44(extraout_var,iVar1);
    std::__cxx11::string::~string((string *)&value._M_string_length);
    if (flag == (FlagBase *)0x0) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_98,'\x01');
      std::operator+(&errorMessage,"Flag could not be matched: \'",&local_98);
      std::operator+(&value,&errorMessage,"\'");
      std::__cxx11::string::~string((string *)&errorMessage);
      std::__cxx11::string::~string((string *)&local_98);
      pPVar2 = (ParseError *)__cxa_allocate_exception(0x10);
      ParseError::ParseError(pPVar2,&value);
      __cxa_throw(pPVar2,&ParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var4._M_p = _Var4._M_p + 1;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&value,_Var4._M_p,argchunk._M_dataplus._M_p + argchunk._M_string_length);
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_98,'\x01');
    ParseArgsValues<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&errorMessage,this,flag,&local_98,it,end,this->allowSeparateShortValue,
               this->allowJoinedShortValue,value._M_string_length != 0,&value,
               value._M_string_length != 0,&values);
    std::__cxx11::string::~string((string *)&local_98);
    if (errorMessage._M_string_length != 0) {
      pPVar2 = (ParseError *)__cxa_allocate_exception(0x10);
      ParseError::ParseError(pPVar2,&errorMessage);
      __cxa_throw(pPVar2,&ParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->readCompletion == false) {
      (*(flag->super_NamedBase).super_Base._vptr_Base[0x14])(flag,&values);
    }
    bVar5 = ((flag->super_NamedBase).super_Base.options & KickOut) != None;
    if (bVar5) {
      it->_M_current = it->_M_current + 1;
      cVar3 = '\x01';
    }
    else {
      cVar3 = (values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
              values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) * '\x02';
    }
    bVar6 = values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::~string((string *)&errorMessage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&values);
    std::__cxx11::string::~string((string *)&value);
  } while (!bVar5 && bVar6);
  std::__cxx11::string::~string((string *)&argchunk);
  return cVar3 == '\x02';
}

Assistant:

bool ParseShort(It &it, It end)
            {
                const auto &chunk = *it;
                const auto argchunk = chunk.substr(shortprefix.size());
                for (auto argit = std::begin(argchunk); argit != std::end(argchunk); ++argit)
                {
                    const auto arg = *argit;

                    if (auto flag = Match(arg))
                    {
                        const std::string value(argit + 1, std::end(argchunk));
                        std::vector<std::string> values;
                        const std::string errorMessage = ParseArgsValues(*flag, std::string(1, arg), it, end,
                                                                         allowSeparateShortValue, allowJoinedShortValue,
                                                                         !value.empty(), value, !value.empty(), values);

                        if (!errorMessage.empty())
                        {
#ifndef ARGS_NOEXCEPT
                            throw ParseError(errorMessage);
#else
                            error = Error::Parse;
                            errorMsg = errorMessage;
                            return false;
#endif
                        }

                        if (!readCompletion)
                        {
                            flag->ParseValue(values);
                        }

                        if (flag->KickOut())
                        {
                            ++it;
                            return false;
                        }

                        if (!values.empty())
                        {
                            break;
                        }
                    } else
                    {
                        const std::string errorMessage("Flag could not be matched: '" + std::string(1, arg) + "'");
#ifndef ARGS_NOEXCEPT
                        throw ParseError(errorMessage);
#else
                        error = Error::Parse;
                        errorMsg = errorMessage;
                        return false;
#endif
                    }
                }

                return true;
            }